

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalProgramTrigger.cpp
# Opt level: O2

void * ExternalProgramTriggerThread(void *pParam)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  FILE *__stream_00;
  int iVar4;
  int iVar5;
  CHRONO chrono;
  char logexternalprogramtriggerfilename [256];
  CHRONO local_180;
  char local_138 [264];
  
  pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
  pcVar3 = strtimeex_fns();
  iVar5 = (int)pParam;
  sprintf(local_138,"log/logexternalprogramtrigger%d_%.64s.csv",(ulong)pParam & 0xffffffff,pcVar3);
  pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
  __stream = fopen(local_138,"w");
  if (__stream == (FILE *)0x0) {
    puts("Unable to create log file.");
  }
  else {
    fprintf(__stream,"%% Time (in s); Trigger (1 : on, 0 : off);\n");
    fflush(__stream);
    StartChrono(&local_180);
    do {
      do {
        uVar1 = period_externalprogramtrigger[iVar5] * 1000;
        if (period_externalprogramtrigger[iVar5] < 1) {
          uVar1 = 100000;
        }
        uSleep((ulong)uVar1);
        if (bExit != 0) goto LAB_0016ca45;
      } while (bExternalProgramTrigger[iVar5] == 0);
      pthread_mutex_lock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar5));
      __stream_00 = fopen(ExternalProgramTriggerFileName[iVar5],"r");
      if (__stream_00 != (FILE *)0x0) {
        fclose(__stream_00);
        bExternalProgramTriggerDetected[iVar5] = 1;
        GetTimeElapsedChronoQuick(&local_180);
        fprintf(__stream,"%f;%d;\n",(ulong)(uint)bExternalProgramTriggerDetected[iVar5]);
        fflush(__stream);
        if (procid_externalprogramtrigger[iVar5] != -1) {
          bExternalProgramTrigger[iVar5] = 0;
          for (iVar4 = 0; iVar4 < nbretries_externalprogramtrigger[iVar5]; iVar4 = iVar4 + 1) {
            iVar2 = remove(ExternalProgramTriggerFileName[iVar5]);
            if (iVar2 == 0) break;
            uSleep((long)retrydelay_externalprogramtrigger[iVar5] * 1000);
          }
          iVar4 = procid_externalprogramtrigger[iVar5];
          if (bEcho != 0) {
            printf("execute %d\n");
            iVar4 = procid_externalprogramtrigger[iVar5];
          }
          ExecuteProcedure(iVar4);
          bWaiting = 0;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(ExternalProgramTriggerCS + iVar5));
    } while (bExit == 0);
LAB_0016ca45:
    StopChronoQuick(&local_180);
    fclose(__stream);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ExternalProgramTriggerThread(void* pParam)
{
	int id = (int)(intptr_t)pParam;

	FILE* logexternalprogramtriggerfile = NULL;
	char logexternalprogramtriggerfilename[MAX_BUF_LEN];

	FILE* file = NULL;
	int i = 0;
	CHRONO chrono;

	EnterCriticalSection(&strtimeCS);
	sprintf(logexternalprogramtriggerfilename, LOG_FOLDER"logexternalprogramtrigger%d_%.64s.csv", id, strtimeex_fns());
	LeaveCriticalSection(&strtimeCS);
	logexternalprogramtriggerfile = fopen(logexternalprogramtriggerfilename, "w");
	if (logexternalprogramtriggerfile == NULL)
	{
		printf("Unable to create log file.\n");
		if (!bExit) bExit = TRUE; // Unexpected program exit...
		return 0;
	}

	fprintf(logexternalprogramtriggerfile, "%% Time (in s); Trigger (1 : on, 0 : off);\n");
	fflush(logexternalprogramtriggerfile);

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*(period_externalprogramtrigger[id] > 0? period_externalprogramtrigger[id]: 100));

		if (bExit) break;
		if (!bExternalProgramTrigger[id]) continue;

		EnterCriticalSection(&ExternalProgramTriggerCS[id]);

		file = fopen(ExternalProgramTriggerFileName[id], "r");
		if (file != NULL)
		{
			fclose(file);
			bExternalProgramTriggerDetected[id] = TRUE;
#pragma region Actions
			fprintf(logexternalprogramtriggerfile, "%f;%d;\n", GetTimeElapsedChronoQuick(&chrono), bExternalProgramTriggerDetected[id]);
			fflush(logexternalprogramtriggerfile);

			if (procid_externalprogramtrigger[id] != -1)
			{
				// disableexternalprogramtrigger to avoid multiple execute...
				bExternalProgramTrigger[id] = FALSE;
				for (i = 0; i < nbretries_externalprogramtrigger[id]; i++)
				{
					if (remove(ExternalProgramTriggerFileName[id]) == 0) break;
					uSleep(1000*retrydelay_externalprogramtrigger[id]);
				}
				if (bEcho) printf("execute %d\n", procid_externalprogramtrigger[id]);
				ExecuteProcedure(procid_externalprogramtrigger[id]);
				bWaiting = FALSE; // To interrupt and force execution of the next commands...
			}
#pragma endregion
		}

		LeaveCriticalSection(&ExternalProgramTriggerCS[id]);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	fclose(logexternalprogramtriggerfile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}